

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O1

bool __thiscall
DIS::ElectromagneticEmissionBeamData::operator==
          (ElectromagneticEmissionBeamData *this,ElectromagneticEmissionBeamData *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  pointer pTVar16;
  long lVar17;
  ulong uVar18;
  
  uVar1 = rhs->_beamDataLength;
  uVar2 = this->_beamDataLength;
  uVar3 = rhs->_beamIDNumber;
  uVar4 = this->_beamIDNumber;
  uVar11 = rhs->_beamParameterIndex;
  uVar12 = this->_beamParameterIndex;
  bVar13 = EEFundamentalParameterData::operator==
                     (&this->_fundamentalParameterData,&rhs->_fundamentalParameterData);
  bVar14 = BeamData::operator==(&this->_beamData,&rhs->_beamData);
  uVar5 = this->_beamFunction;
  uVar6 = rhs->_beamFunction;
  uVar7 = rhs->_highDensityTrackJam;
  uVar8 = this->_highDensityTrackJam;
  uVar9 = rhs->_beamStatus;
  uVar10 = this->_beamStatus;
  bVar15 = JammingTechnique::operator==(&this->_jammingTechnique,&rhs->_jammingTechnique);
  bVar13 = ((uVar12 == uVar11 && uVar4 == uVar3) && uVar2 == uVar1) &&
           ((uVar8 == uVar7 && (uVar5 == uVar6 && (bVar14 && bVar13))) &&
           (bVar15 && uVar10 == uVar9));
  pTVar16 = (this->_trackJamTargets).
            super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_trackJamTargets).
      super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar16) {
    lVar17 = 0;
    uVar18 = 0;
    do {
      bVar14 = TrackJamData::operator==
                         ((TrackJamData *)((long)&pTVar16->_vptr_TrackJamData + lVar17),
                          (TrackJamData *)
                          ((long)&((rhs->_trackJamTargets).
                                   super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_vptr_TrackJamData +
                          lVar17));
      if (!bVar14) {
        bVar13 = false;
      }
      uVar18 = uVar18 + 1;
      pTVar16 = (this->_trackJamTargets).
                super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x30;
    } while (uVar18 < (ulong)(((long)(this->_trackJamTargets).
                                     super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar16 >> 4
                              ) * -0x5555555555555555));
  }
  return bVar13;
}

Assistant:

bool ElectromagneticEmissionBeamData::operator ==(const ElectromagneticEmissionBeamData& rhs) const
{
    bool ivarsEqual = true;

    if( ! (_beamDataLength == rhs._beamDataLength) ) ivarsEqual = false;
    if( ! (_beamIDNumber == rhs._beamIDNumber) ) ivarsEqual = false;
    if( ! (_beamParameterIndex == rhs._beamParameterIndex) ) ivarsEqual = false;
    if( ! (_fundamentalParameterData == rhs._fundamentalParameterData) ) ivarsEqual = false;
	if (! (_beamData == rhs._beamData)) ivarsEqual = false;
    if( ! (_beamFunction == rhs._beamFunction) ) ivarsEqual = false;
    if( ! (_highDensityTrackJam == rhs._highDensityTrackJam) ) ivarsEqual = false;
    if( ! (_beamStatus == rhs._beamStatus) ) ivarsEqual = false;
    if( ! (_jammingTechnique == rhs._jammingTechnique) ) ivarsEqual = false;

    for(size_t idx = 0; idx < _trackJamTargets.size(); idx++)
    {
       if( ! ( _trackJamTargets[idx] == rhs._trackJamTargets[idx]) ) ivarsEqual = false;
    }

    return ivarsEqual;
}